

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::parse_equals_row(Parser *this)

{
  char cVar1;
  int iVar2;
  _Head_base<0UL,_TextProvider_*,_false> _Var3;
  
  _Var3._M_head_impl =
       (this->m_text_provider)._M_t.
       super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
       super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
       super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl;
  while( true ) {
    iVar2 = (*(_Var3._M_head_impl)->_vptr_TextProvider[2])();
    if ((char)iVar2 == '\0') {
      return;
    }
    cVar1 = (**(code **)((long)((this->m_text_provider)._M_t.
                                super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                               _vptr_TextProvider + 0x28))();
    if (cVar1 != '=') break;
    (**(code **)((long)((this->m_text_provider)._M_t.
                        super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t
                        .super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
                        super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                       _vptr_TextProvider + 0x18))();
    _Var3._M_head_impl =
         (this->m_text_provider)._M_t.
         super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
         super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
         super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl;
  }
  return;
}

Assistant:

void Parser::parse_equals_row()
{
	while(m_text_provider->is_valid() && m_text_provider->peek() == '=')
	{
		m_text_provider->advance();
	}
}